

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolk.c
# Opt level: O1

int fffi4int(int *input,long ntodo,double scale,double zero,int nullcheck,int tnull,int nullval,
            char *nullarray,int *anynull,int *output,int *status)

{
  int iVar1;
  long lVar2;
  double dVar3;
  
  if (nullcheck == 0) {
    if (scale != 1.0 || zero != 0.0) {
      if (0 < ntodo) {
        lVar2 = 0;
        do {
          dVar3 = (double)input[lVar2] * scale + zero;
          if (-2147483648.49 <= dVar3) {
            if (dVar3 <= 2147483647.49) {
              iVar1 = (int)dVar3;
            }
            else {
              *status = -0xb;
              iVar1 = 0x7fffffff;
            }
          }
          else {
            *status = -0xb;
            iVar1 = -0x80000000;
          }
          output[lVar2] = iVar1;
          lVar2 = lVar2 + 1;
        } while (ntodo != lVar2);
      }
    }
    else if (0 < ntodo) {
      lVar2 = 0;
      do {
        output[lVar2] = input[lVar2];
        lVar2 = lVar2 + 1;
      } while (ntodo != lVar2);
    }
  }
  else if (scale != 1.0 || zero != 0.0) {
    if (0 < ntodo) {
      lVar2 = 0;
      do {
        if (input[lVar2] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar2] = nullval;
          }
          else {
            nullarray[lVar2] = '\x01';
          }
        }
        else {
          dVar3 = (double)input[lVar2] * scale + zero;
          if (-2147483648.49 <= dVar3) {
            if (dVar3 <= 2147483647.49) {
              output[lVar2] = (int)dVar3;
            }
            else {
              *status = -0xb;
              output[lVar2] = 0x7fffffff;
            }
          }
          else {
            *status = -0xb;
            output[lVar2] = -0x80000000;
          }
        }
        lVar2 = lVar2 + 1;
      } while (ntodo != lVar2);
    }
  }
  else if (0 < ntodo) {
    lVar2 = 0;
    do {
      if (input[lVar2] == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar2] = nullval;
        }
        else {
          nullarray[lVar2] = '\x01';
        }
      }
      else {
        output[lVar2] = input[lVar2];
      }
      lVar2 = lVar2 + 1;
    } while (ntodo != lVar2);
  }
  return *status;
}

Assistant:

int fffi4int(INT32BIT *input,     /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            INT32BIT tnull,       /* I - value of FITS TNULLn keyword if any */
            int  nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            int  *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
                output[ii] = (int) input[ii];   /* copy input to output */
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DINT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = INT_MIN;
                }
                else if (dvalue > DINT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = INT_MAX;
                }
                else
                    output[ii] = (int) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] = (int) input[ii];

            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DINT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MIN;
                    }
                    else if (dvalue > DINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = INT_MAX;
                    }
                    else
                        output[ii] = (int) dvalue;
                }
            }
        }
    }
    return(*status);
}